

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxin.cpp
# Opt level: O0

void __thiscall
ConfidentialTxIn_EstimateTxInSize_Test::TestBody(ConfidentialTxIn_EstimateTxInSize_Test *this)

{
  AddressType addr_type;
  uint32_t pegin_btc_tx_size;
  initializer_list<TestEstimateConfidentialTxInSizeVector> __l;
  bool bVar1;
  int iVar2;
  reference pTVar3;
  ulong uVar4;
  char *pcVar5;
  TestEstimateConfidentialTxInSizeVector *local_ee8;
  AssertHelper local_ca8;
  Message local_ca0;
  int local_c94;
  undefined1 local_c90 [8];
  AssertionResult gtest_ar_3;
  Message local_c78;
  int local_c6c;
  undefined1 local_c68 [8];
  AssertionResult gtest_ar_2;
  Message local_c50;
  undefined1 local_c48 [8];
  AssertionResult gtest_ar_1;
  Message local_c30;
  undefined1 local_c28 [8];
  AssertionResult gtest_ar;
  Message local_c10 [2];
  Script local_c00;
  Script local_bc8;
  uint32_t local_b8c;
  Script *pSStack_b88;
  uint32_t cache_size;
  Script *template_ptr;
  Script script_template;
  uint32_t wit_size;
  uint32_t size;
  TestEstimateConfidentialTxInSizeVector *test_data;
  const_iterator __end1;
  const_iterator __begin1;
  vector<TestEstimateConfidentialTxInSizeVector,_std::allocator<TestEstimateConfidentialTxInSizeVector>_>
  *__range1;
  undefined1 local_b18;
  undefined1 local_b17;
  undefined1 local_b16;
  allocator local_b15;
  undefined1 local_b14;
  undefined1 local_b13;
  allocator local_b12;
  undefined1 local_b11;
  undefined1 local_b10;
  allocator local_b0f;
  undefined1 local_b0e;
  undefined1 local_b0d;
  allocator local_b0c;
  undefined1 local_b0b;
  undefined1 local_b0a;
  allocator local_b09;
  undefined1 local_b08;
  undefined1 local_b07;
  allocator local_b06;
  undefined1 local_b05;
  undefined1 local_b04;
  allocator local_b03;
  undefined1 local_b02;
  undefined1 local_b01;
  allocator local_b00;
  undefined1 local_aff;
  undefined1 local_afe;
  allocator local_afd;
  undefined1 local_afc;
  undefined1 local_afb;
  allocator local_afa;
  allocator local_af9;
  string local_af8;
  undefined1 local_ad1;
  undefined1 local_ad0;
  allocator local_acf;
  undefined1 local_ace;
  undefined1 local_acd;
  allocator local_acc;
  undefined1 local_acb;
  undefined1 local_aca;
  allocator local_ac9;
  TestEstimateConfidentialTxInSizeVector *local_ac8;
  TestEstimateConfidentialTxInSizeVector local_ac0;
  undefined4 local_a00;
  undefined4 local_9fc;
  undefined4 local_9f8;
  Script local_9f0;
  undefined4 local_9b8;
  Script SStack_9b0;
  undefined1 local_978;
  undefined1 local_977;
  undefined1 local_976;
  string asStack_970 [32];
  undefined4 local_950;
  undefined4 local_94c;
  undefined4 local_948;
  undefined4 local_940;
  undefined4 local_93c;
  undefined4 local_938;
  Script local_930;
  undefined4 local_8f8;
  Script SStack_8f0;
  undefined1 local_8b8;
  undefined1 local_8b7;
  undefined1 local_8b6;
  string asStack_8b0 [32];
  undefined4 local_890;
  undefined4 local_88c;
  undefined4 local_888;
  undefined4 local_880;
  undefined4 local_87c;
  undefined4 local_878;
  Script local_870;
  undefined4 local_838;
  Script SStack_830;
  undefined1 local_7f8;
  undefined1 local_7f7;
  undefined1 local_7f6;
  string asStack_7f0 [32];
  undefined4 local_7d0;
  undefined4 local_7cc;
  undefined4 local_7c8;
  undefined4 local_7c0;
  undefined4 local_7bc;
  undefined4 local_7b8;
  Script local_7b0;
  undefined4 local_778;
  Script SStack_770;
  undefined1 local_738;
  undefined1 local_737;
  undefined1 local_736;
  string asStack_730 [32];
  undefined4 local_710;
  undefined4 local_70c;
  undefined4 local_708;
  undefined4 local_700;
  undefined4 local_6fc;
  undefined4 local_6f8;
  Script local_6f0;
  undefined4 local_6b8;
  Script SStack_6b0;
  undefined1 local_678;
  undefined1 local_677;
  undefined1 local_676;
  string asStack_670 [32];
  undefined4 local_650;
  undefined4 local_64c;
  undefined4 local_648;
  undefined4 local_640;
  undefined4 local_63c;
  undefined4 local_638;
  Script local_630;
  undefined4 local_5f8;
  Script SStack_5f0;
  undefined1 local_5b8;
  undefined1 local_5b7;
  undefined1 local_5b6;
  string asStack_5b0 [32];
  undefined4 local_590;
  undefined4 local_58c;
  undefined4 local_588;
  undefined4 local_580;
  undefined4 local_57c;
  undefined4 local_578;
  Script local_570;
  undefined4 local_538;
  Script SStack_530;
  undefined1 local_4f8;
  undefined1 local_4f7;
  undefined1 local_4f6;
  string asStack_4f0 [32];
  undefined4 local_4d0;
  undefined4 local_4cc;
  undefined4 local_4c8;
  undefined4 local_4c0;
  undefined4 local_4bc;
  undefined4 local_4b8;
  Script local_4b0;
  undefined4 local_478;
  Script SStack_470;
  undefined1 local_438;
  undefined1 local_437;
  undefined1 local_436;
  string asStack_430 [32];
  undefined4 local_410;
  undefined4 local_40c;
  undefined4 local_408;
  undefined4 local_400;
  undefined4 local_3fc;
  undefined4 local_3f8;
  Script local_3f0;
  undefined4 local_3b8;
  Script SStack_3b0;
  undefined1 local_378;
  undefined1 local_377;
  undefined1 local_376;
  string asStack_370 [32];
  undefined4 local_350;
  undefined4 local_34c;
  undefined4 local_348;
  undefined4 local_340;
  undefined4 local_33c;
  undefined4 local_338;
  Script local_330;
  undefined4 local_2f8;
  Script SStack_2f0;
  undefined1 local_2b8;
  undefined1 local_2b7;
  undefined1 local_2b6;
  string asStack_2b0 [32];
  undefined4 local_290;
  undefined4 local_28c;
  undefined4 local_288;
  undefined4 local_280;
  undefined4 local_27c;
  undefined4 local_278;
  Script local_270;
  undefined4 local_238;
  Script SStack_230;
  undefined1 local_1f8;
  undefined1 local_1f7;
  undefined1 local_1f6;
  string asStack_1f0 [32];
  undefined4 local_1d0;
  undefined4 local_1cc;
  undefined4 local_1c8;
  undefined4 local_1c0;
  undefined4 local_1bc;
  undefined4 local_1b8;
  Script local_1b0;
  undefined4 local_178;
  Script SStack_170;
  undefined1 local_138;
  undefined1 local_137;
  undefined1 local_136;
  string asStack_130 [32];
  undefined4 local_110;
  undefined4 local_10c;
  undefined4 local_108;
  undefined4 local_100;
  undefined4 local_fc;
  undefined4 local_f8;
  Script local_f0;
  undefined4 local_b8;
  Script SStack_b0;
  undefined1 local_78;
  undefined1 local_77;
  undefined1 local_76;
  string asStack_70 [32];
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  iterator local_40;
  size_type local_38;
  allocator local_2d [20];
  allocator local_19;
  ConfidentialTxIn_EstimateTxInSize_Test *local_18;
  ConfidentialTxIn_EstimateTxInSize_Test *this_local;
  
  local_18 = this;
  if ((TestBody()::multisig_script_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&TestBody()::multisig_script_abi_cxx11_), iVar2 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&TestBody()::multisig_script_abi_cxx11_,
               "522102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b8253ae"
               ,&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
    __cxa_atexit(std::__cxx11::string::~string,&TestBody()::multisig_script_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&TestBody()::multisig_script_abi_cxx11_);
  }
  if ((TestBody()::scriptsig_template_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&TestBody()::scriptsig_template_abi_cxx11_), iVar2 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&TestBody()::scriptsig_template_abi_cxx11_,
               "00473044022047ac8e878352d3ebbde1c94ce3a10d057c24175747116f8288e5d794d12d482f0220217f36a485cae903c713331d877c1f64677e3622ad4010726870540656fe9dcb014752210205ffcdde75f262d66ada3dd877c7471f8f8ee9ee24d917c3e18d01cee458bafe2102be61f4350b4ae7544f99649a917f48ba16cf48c983ac1599774958d88ad17ec552ae"
               ,local_2d);
    std::allocator<char>::~allocator((allocator<char> *)local_2d);
    __cxa_atexit(std::__cxx11::string::~string,&TestBody()::scriptsig_template_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&TestBody()::scriptsig_template_abi_cxx11_);
  }
  if ((TestBody()::test_vector == '\0') &&
     (iVar2 = __cxa_guard_acquire(&TestBody()::test_vector), iVar2 != 0)) {
    local_b18 = 1;
    local_ac8 = &local_ac0;
    local_ac0.addr_type = kP2pkhAddress;
    local_ac0.size = 0x96;
    local_ac0.witness_size = 0;
    cfd::core::Script::Script(&local_ac0.redeem_script);
    local_acb = 1;
    local_ac0.pegin_btc_tx = 0;
    cfd::core::Script::Script(&local_ac0.claim_script);
    local_aca = 1;
    local_ac0.is_issuance = false;
    local_ac0.is_blind = false;
    local_ac0.is_reissuance = false;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_ac0.script_template,"",&local_ac9);
    local_ac0.exponent = 0;
    local_ac0.minimum_bits = 0;
    local_ac0.txoutproof_size = 0;
    local_aca = 0;
    local_acb = 0;
    local_ac8 = (TestEstimateConfidentialTxInSizeVector *)&local_a00;
    local_a00 = 1;
    local_9fc = 0xcd;
    local_9f8 = 0;
    cfd::core::Script::Script(&local_9f0,&exp_script);
    local_ace = 1;
    local_9b8 = 0;
    cfd::core::Script::Script(&SStack_9b0);
    local_acd = 1;
    local_978 = 0;
    local_977 = 0;
    local_976 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(asStack_970,"",&local_acc);
    local_950 = 0;
    local_94c = 0;
    local_948 = 0;
    local_acd = 0;
    local_ace = 0;
    local_ac8 = (TestEstimateConfidentialTxInSizeVector *)&local_940;
    local_940 = 6;
    local_93c = 0xb0;
    local_938 = 0x70;
    cfd::core::Script::Script(&local_930);
    local_ad1 = 1;
    local_8f8 = 0;
    cfd::core::Script::Script(&SStack_8f0);
    local_ad0 = 1;
    local_8b8 = 0;
    local_8b7 = 0;
    local_8b6 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(asStack_8b0,"",&local_acf);
    local_890 = 0;
    local_88c = 0;
    local_888 = 0;
    local_ad0 = 0;
    local_ad1 = 0;
    local_ac8 = (TestEstimateConfidentialTxInSizeVector *)&local_880;
    local_880 = 5;
    local_87c = 0xde;
    local_878 = 0x92;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_af8,"51",&local_af9);
    cfd::core::Script::Script(&local_870,&local_af8);
    local_afc = 1;
    local_838 = 0;
    cfd::core::Script::Script(&SStack_830);
    local_afb = 1;
    local_7f8 = 0;
    local_7f7 = 0;
    local_7f6 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(asStack_7f0,"",&local_afa);
    local_7d0 = 0;
    local_7cc = 0;
    local_7c8 = 0;
    local_afb = 0;
    local_afc = 0;
    local_ac8 = (TestEstimateConfidentialTxInSizeVector *)&local_7c0;
    local_7c0 = 4;
    local_7bc = 0x99;
    local_7b8 = 0x70;
    cfd::core::Script::Script(&local_7b0);
    local_aff = 1;
    local_778 = 0;
    cfd::core::Script::Script(&SStack_770);
    local_afe = 1;
    local_738 = 0;
    local_737 = 0;
    local_736 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(asStack_730,"",&local_afd);
    local_710 = 0;
    local_70c = 0;
    local_708 = 0;
    local_afe = 0;
    local_aff = 0;
    local_ac8 = (TestEstimateConfidentialTxInSizeVector *)&local_700;
    local_700 = 3;
    local_6fc = 0xd0;
    local_6f8 = 0xa7;
    cfd::core::Script::Script(&local_6f0,&exp_script);
    local_b02 = 1;
    local_6b8 = 0;
    cfd::core::Script::Script(&SStack_6b0);
    local_b01 = 1;
    local_678 = 0;
    local_677 = 0;
    local_676 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(asStack_670,"",&local_b00);
    local_650 = 0;
    local_64c = 0;
    local_648 = 0;
    local_b01 = 0;
    local_b02 = 0;
    local_ac8 = (TestEstimateConfidentialTxInSizeVector *)&local_640;
    local_640 = 3;
    local_63c = 0x12d;
    local_638 = 0x104;
    cfd::core::Script::Script(&local_630,&TestBody()::multisig_script_abi_cxx11_);
    local_b05 = 1;
    local_5f8 = 0;
    cfd::core::Script::Script(&SStack_5f0);
    local_b04 = 1;
    local_5b8 = 0;
    local_5b7 = 0;
    local_5b6 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(asStack_5b0,"",&local_b03);
    local_590 = 0;
    local_58c = 0;
    local_588 = 0;
    local_b04 = 0;
    local_b05 = 0;
    local_ac8 = (TestEstimateConfidentialTxInSizeVector *)&local_580;
    local_580 = 3;
    local_57c = 0xbf;
    local_578 = 0x96;
    cfd::core::Script::Script(&local_570,&exp_script);
    local_538 = 0;
    cfd::core::Script::Script(&SStack_530);
    local_4f8 = 0;
    local_4f7 = 0;
    local_4f6 = 0;
    std::__cxx11::string::string(asStack_4f0,(string *)&TestBody()::scriptsig_template_abi_cxx11_);
    local_4d0 = 0;
    local_4cc = 0;
    local_4c8 = 0;
    local_ac8 = (TestEstimateConfidentialTxInSizeVector *)&local_4c0;
    local_4c0 = 4;
    local_4bc = 0x35c;
    local_4b8 = 0x333;
    cfd::core::Script::Script(&local_4b0);
    local_b08 = 1;
    local_478 = 0xe2;
    cfd::core::Script::Script(&SStack_470);
    local_b07 = 1;
    local_438 = 0;
    local_437 = 0;
    local_436 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(asStack_430,"",&local_b06);
    local_410 = 0;
    local_40c = 0;
    local_408 = 400;
    local_b07 = 0;
    local_b08 = 0;
    local_ac8 = (TestEstimateConfidentialTxInSizeVector *)&local_400;
    local_400 = 4;
    local_3fc = 0xeb;
    local_3f8 = 0x70;
    cfd::core::Script::Script(&local_3f0);
    local_b0b = 1;
    local_3b8 = 0;
    cfd::core::Script::Script(&SStack_3b0);
    local_b0a = 1;
    local_378 = 1;
    local_377 = 0;
    local_376 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(asStack_370,"",&local_b09);
    local_350 = 0;
    local_34c = 0;
    local_348 = 0;
    local_b0a = 0;
    local_b0b = 0;
    local_ac8 = (TestEstimateConfidentialTxInSizeVector *)&local_340;
    local_340 = 4;
    local_33c = 0x2133;
    local_338 = 0x2088;
    cfd::core::Script::Script(&local_330);
    local_b0e = 1;
    local_2f8 = 0;
    cfd::core::Script::Script(&SStack_2f0);
    local_b0d = 1;
    local_2b8 = 1;
    local_2b7 = 1;
    local_2b6 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(asStack_2b0,"",&local_b0c);
    local_290 = 0;
    local_28c = 0x24;
    local_288 = 0;
    local_b0d = 0;
    local_b0e = 0;
    local_ac8 = (TestEstimateConfidentialTxInSizeVector *)&local_280;
    local_280 = 4;
    local_27c = 0x21b3;
    local_278 = 0x2108;
    cfd::core::Script::Script(&local_270);
    local_b11 = 1;
    local_238 = 0;
    cfd::core::Script::Script(&SStack_230);
    local_b10 = 1;
    local_1f8 = 1;
    local_1f7 = 1;
    local_1f6 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(asStack_1f0,"",&local_b0f);
    local_1d0 = 0;
    local_1cc = 0x34;
    local_1c8 = 0;
    local_b10 = 0;
    local_b11 = 0;
    local_ac8 = (TestEstimateConfidentialTxInSizeVector *)&local_1c0;
    local_1c0 = 4;
    local_1bc = 0x1127;
    local_1b8 = 0x107c;
    cfd::core::Script::Script(&local_1b0);
    local_b14 = 1;
    local_178 = 0;
    cfd::core::Script::Script(&SStack_170);
    local_b13 = 1;
    local_138 = 1;
    local_137 = 1;
    local_136 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(asStack_130,"",&local_b12);
    local_110 = 0;
    local_10c = 0x24;
    local_108 = 0;
    local_b13 = 0;
    local_b14 = 0;
    local_ac8 = (TestEstimateConfidentialTxInSizeVector *)&local_100;
    local_100 = 4;
    local_fc = 0x1167;
    local_f8 = 0x10bc;
    cfd::core::Script::Script(&local_f0);
    local_b17 = 1;
    local_b8 = 0;
    cfd::core::Script::Script(&SStack_b0);
    local_b16 = 1;
    local_78 = 1;
    local_77 = 1;
    local_76 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(asStack_70,"",&local_b15);
    local_50 = 0;
    local_4c = 0x34;
    local_48 = 0;
    local_b16 = 0;
    local_b17 = 0;
    local_b18 = 0;
    local_40 = &local_ac0;
    local_38 = 0xe;
    std::allocator<TestEstimateConfidentialTxInSizeVector>::allocator
              ((allocator<TestEstimateConfidentialTxInSizeVector> *)((long)&__range1 + 7));
    __l._M_len = local_38;
    __l._M_array = local_40;
    std::
    vector<TestEstimateConfidentialTxInSizeVector,_std::allocator<TestEstimateConfidentialTxInSizeVector>_>
    ::vector(&TestBody::test_vector,__l,
             (allocator<TestEstimateConfidentialTxInSizeVector> *)((long)&__range1 + 7));
    std::allocator<TestEstimateConfidentialTxInSizeVector>::~allocator
              ((allocator<TestEstimateConfidentialTxInSizeVector> *)((long)&__range1 + 7));
    local_ee8 = (TestEstimateConfidentialTxInSizeVector *)&local_40;
    do {
      local_ee8 = local_ee8 + -1;
      TestEstimateConfidentialTxInSizeVector::~TestEstimateConfidentialTxInSizeVector(local_ee8);
    } while (local_ee8 != &local_ac0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b15);
    std::allocator<char>::~allocator((allocator<char> *)&local_b12);
    std::allocator<char>::~allocator((allocator<char> *)&local_b0f);
    std::allocator<char>::~allocator((allocator<char> *)&local_b0c);
    std::allocator<char>::~allocator((allocator<char> *)&local_b09);
    std::allocator<char>::~allocator((allocator<char> *)&local_b06);
    std::allocator<char>::~allocator((allocator<char> *)&local_b03);
    std::allocator<char>::~allocator((allocator<char> *)&local_b00);
    std::allocator<char>::~allocator((allocator<char> *)&local_afd);
    std::allocator<char>::~allocator((allocator<char> *)&local_afa);
    std::__cxx11::string::~string((string *)&local_af8);
    std::allocator<char>::~allocator((allocator<char> *)&local_af9);
    std::allocator<char>::~allocator((allocator<char> *)&local_acf);
    std::allocator<char>::~allocator((allocator<char> *)&local_acc);
    std::allocator<char>::~allocator((allocator<char> *)&local_ac9);
    __cxa_atexit(std::
                 vector<TestEstimateConfidentialTxInSizeVector,_std::allocator<TestEstimateConfidentialTxInSizeVector>_>
                 ::~vector,&TestBody::test_vector,&__dso_handle);
    __cxa_guard_release(&TestBody()::test_vector);
  }
  __end1 = std::
           vector<TestEstimateConfidentialTxInSizeVector,_std::allocator<TestEstimateConfidentialTxInSizeVector>_>
           ::begin(&TestBody::test_vector);
  test_data = (TestEstimateConfidentialTxInSizeVector *)
              std::
              vector<TestEstimateConfidentialTxInSizeVector,_std::allocator<TestEstimateConfidentialTxInSizeVector>_>
              ::end(&TestBody::test_vector);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_TestEstimateConfidentialTxInSizeVector_*,_std::vector<TestEstimateConfidentialTxInSizeVector,_std::allocator<TestEstimateConfidentialTxInSizeVector>_>_>
                                     *)&test_data), bVar1) {
    pTVar3 = __gnu_cxx::
             __normal_iterator<const_TestEstimateConfidentialTxInSizeVector_*,_std::vector<TestEstimateConfidentialTxInSizeVector,_std::allocator<TestEstimateConfidentialTxInSizeVector>_>_>
             ::operator*(&__end1);
    script_template.script_stack_.
    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    script_template.script_stack_.
    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    cfd::core::Script::Script((Script *)&template_ptr,&pTVar3->script_template);
    pSStack_b88 = (Script *)0x0;
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      pSStack_b88 = (Script *)&template_ptr;
    }
    local_b8c = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        addr_type = pTVar3->addr_type;
        cfd::core::Script::Script(&local_bc8,&pTVar3->redeem_script);
        pegin_btc_tx_size = pTVar3->pegin_btc_tx;
        cfd::core::Script::Script(&local_c00,&pTVar3->claim_script);
        script_template.script_stack_.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             cfd::core::ConfidentialTxIn::EstimateTxInSize
                       (addr_type,&local_bc8,pegin_btc_tx_size,&local_c00,
                        (bool)(pTVar3->is_issuance & 1),(bool)(pTVar3->is_blind & 1),
                        (uint32_t *)
                        &script_template.script_stack_.
                         super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(uint32_t *)0x0,
                        (bool)(pTVar3->is_reissuance & 1),pSStack_b88,pTVar3->exponent,
                        pTVar3->minimum_bits,&local_b8c,pTVar3->txoutproof_size);
        cfd::core::Script::~Script(&local_c00);
        cfd::core::Script::~Script(&local_bc8);
      }
    }
    else {
      testing::Message::Message(local_c10);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
                 ,0x11c,
                 "Expected: (size = ConfidentialTxIn::EstimateTxInSize( test_data.addr_type, test_data.redeem_script, test_data.pegin_btc_tx, test_data.claim_script, test_data.is_issuance, test_data.is_blind, &wit_size, nullptr, test_data.is_reissuance, template_ptr, test_data.exponent, test_data.minimum_bits, &cache_size, test_data.txoutproof_size)) doesn\'t throw an exception.\n  Actual: it throws."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_c10);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
      testing::Message::~Message(local_c10);
    }
    testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
              ((EqHelper<false> *)local_c28,"size","test_data.size",
               (uint *)((long)&script_template.script_stack_.
                               super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),&pTVar3->size
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c28);
    if (!bVar1) {
      testing::Message::Message(&local_c30);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_c28);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
                 ,0x11d,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_c30);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_c30);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_c28);
    testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
              ((EqHelper<false> *)local_c48,"wit_size","test_data.witness_size",
               (uint *)&script_template.script_stack_.
                        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,&pTVar3->witness_size);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c48);
    if (!bVar1) {
      testing::Message::Message(&local_c50);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_c48);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
                 ,0x11e,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_c50);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_c50);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_c48);
    if (pTVar3->minimum_bits == 0x24) {
      local_c6c = 0x100d;
      testing::internal::EqHelper<false>::Compare<unsigned_int,int>
                ((EqHelper<false> *)local_c68,"cache_size","4109",&local_b8c,&local_c6c);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c68);
      if (!bVar1) {
        testing::Message::Message(&local_c78);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_c68);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
                   ,0x121,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_c78);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_c78);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_c68);
    }
    else if (pTVar3->minimum_bits == 0x34) {
      local_c94 = 0x104d;
      testing::internal::EqHelper<false>::Compare<unsigned_int,int>
                ((EqHelper<false> *)local_c90,"cache_size","4173",&local_b8c,&local_c94);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c90);
      if (!bVar1) {
        testing::Message::Message(&local_ca0);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_c90);
        testing::internal::AssertHelper::AssertHelper
                  (&local_ca8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
                   ,0x123,pcVar5);
        testing::internal::AssertHelper::operator=(&local_ca8,&local_ca0);
        testing::internal::AssertHelper::~AssertHelper(&local_ca8);
        testing::Message::~Message(&local_ca0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_c90);
    }
    cfd::core::Script::~Script((Script *)&template_ptr);
    __gnu_cxx::
    __normal_iterator<const_TestEstimateConfidentialTxInSizeVector_*,_std::vector<TestEstimateConfidentialTxInSizeVector,_std::allocator<TestEstimateConfidentialTxInSizeVector>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

TEST(ConfidentialTxIn, EstimateTxInSize) {
  static const std::string multisig_script = "522102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b8253ae";
  static const std::string scriptsig_template = "00473044022047ac8e878352d3ebbde1c94ce3a10d057c24175747116f8288e5d794d12d482f0220217f36a485cae903c713331d877c1f64677e3622ad4010726870540656fe9dcb014752210205ffcdde75f262d66ada3dd877c7471f8f8ee9ee24d917c3e18d01cee458bafe2102be61f4350b4ae7544f99649a917f48ba16cf48c983ac1599774958d88ad17ec552ae";
  static const std::vector<TestEstimateConfidentialTxInSizeVector> test_vector = {
    {AddressType::kP2pkhAddress, 150, 0, Script(), 0, Script(), false, false, false, "", 0, 0, 0},
    {AddressType::kP2shAddress, 205, 0, exp_script, 0, Script(), false, false, false, "", 0, 0, 0},
    {AddressType::kP2shP2wpkhAddress, 176, 112, Script(), 0, Script(), false, false, false, "", 0, 0, 0},
    {AddressType::kP2shP2wshAddress, 222, 146, Script("51"), 0, Script(), false, false, false, "", 0, 0, 0},
    {AddressType::kP2wpkhAddress, 153, 112, Script(), 0, Script(), false, false, false, "", 0, 0, 0},
    {AddressType::kP2wshAddress, 208, 167, exp_script, 0, Script(), false, false, false, "", 0, 0, 0},
    {AddressType::kP2wshAddress, 301, 260, Script(multisig_script), 0, Script(), false, false, false, "", 0, 0, 0},
    {AddressType::kP2wshAddress, 191, 150, exp_script, 0, Script(), false, false, false, scriptsig_template, 0, 0, 0},
    // pegin
    {AddressType::kP2wpkhAddress, 860, 819, Script(), 226, Script(), false, false, false, "", 0, 0, 400},
    // issue
    {AddressType::kP2wpkhAddress, 235, 112, Script(), 0, Script(), true, false, false, "", 0, 0, 0},
    {AddressType::kP2wpkhAddress, 8499, 8328, Script(), 0, Script(), true, true, false,
        "", 0, 36, 0},
    {AddressType::kP2wpkhAddress, 8627, 8456, Script(), 0, Script(), true, true, false,
        "", 0, 52, 0},
    // reissue
    {AddressType::kP2wpkhAddress, 4391, 4220, Script(), 0, Script(), true, true, true,
        "", 0, 36, 0},
    {AddressType::kP2wpkhAddress, 4455, 4284, Script(), 0, Script(), true, true, true,
        "", 0, 52, 0},
  };

  for (const auto& test_data : test_vector) {
    uint32_t size = 0;
    uint32_t wit_size = 0;
    Script script_template(test_data.script_template);
    Script* template_ptr = nullptr;
    if (!test_data.script_template.empty()) {
      template_ptr = &script_template;
    }
    uint32_t cache_size = 0;
    EXPECT_NO_THROW((size = ConfidentialTxIn::EstimateTxInSize(
        test_data.addr_type, test_data.redeem_script, test_data.pegin_btc_tx,
        test_data.claim_script, test_data.is_issuance, test_data.is_blind,
        &wit_size, nullptr, test_data.is_reissuance, template_ptr,
        test_data.exponent, test_data.minimum_bits, &cache_size,
        test_data.txoutproof_size)));
    EXPECT_EQ(size, test_data.size);
    EXPECT_EQ(wit_size, test_data.witness_size);
    if (test_data.minimum_bits == 36) {
      // EXPECT_EQ(cache_size, 2892);
      EXPECT_EQ(cache_size, 4109);
    } else if (test_data.minimum_bits == 52) {
      EXPECT_EQ(cache_size, 4173);
    }
  }
}